

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

VarValue *
deqp::gles31::Functional::getSamplerFillValue(VarValue *__return_storage_ptr__,VarValue *sampler)

{
  DataType DVar1;
  VarValue *result;
  int local_1c;
  int local_18;
  int i_2;
  int i_1;
  int i;
  VarValue *sampler_local;
  
  DVar1 = getSamplerLookupReturnType(sampler->type);
  __return_storage_ptr__->type = DVar1;
  switch(__return_storage_ptr__->type) {
  case TYPE_FLOAT:
    (__return_storage_ptr__->val).floatV[0] = (sampler->val).floatV[1];
    break;
  default:
    break;
  case TYPE_FLOAT_VEC4:
    for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
      *(undefined4 *)((long)&__return_storage_ptr__->val + (long)i_2 * 4) =
           *(undefined4 *)((long)&sampler->val + (long)i_2 * 4 + 4);
    }
    break;
  case TYPE_INT_VEC4:
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      *(undefined4 *)((long)&__return_storage_ptr__->val + (long)local_1c * 4) =
           *(undefined4 *)((long)&sampler->val + (long)local_1c * 4 + 4);
    }
    break;
  case TYPE_UINT_VEC4:
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      *(undefined4 *)((long)&__return_storage_ptr__->val + (long)local_18 * 4) =
           *(undefined4 *)((long)&sampler->val + (long)local_18 * 4 + 4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue getSamplerFillValue (const VarValue& sampler)
{
	DE_ASSERT(glu::isDataTypeSampler(sampler.type));

	VarValue result;
	result.type = getSamplerLookupReturnType(sampler.type);

	switch (result.type)
	{
		case glu::TYPE_FLOAT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.floatV[i] = sampler.val.samplerV.fillColor.floatV[i];
			break;
		case glu::TYPE_UINT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.uintV[i] = sampler.val.samplerV.fillColor.uintV[i];
			break;
		case glu::TYPE_INT_VEC4:
			for (int i = 0; i < 4; i++)
				result.val.intV[i] = sampler.val.samplerV.fillColor.intV[i];
			break;
		case glu::TYPE_FLOAT:
			result.val.floatV[0] = sampler.val.samplerV.fillColor.floatV[0];
			break;
		default:
			DE_ASSERT(false);
	}

	return result;
}